

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_util.c
# Opt level: O2

void conv_fmt_16to8bit_c(uchar *src_y,uchar *src_uv,uchar **dst,int width,int height,int src_stride,
                        int src_stridec,int *dst_stride,int uv_shift)

{
  int iVar1;
  uint uVar2;
  uchar *puVar3;
  uchar *puVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  uchar *puVar11;
  
  puVar4 = *dst;
  iVar1 = *dst_stride;
  iVar10 = 0;
  uVar7 = 0;
  if (0 < width) {
    uVar7 = (ulong)(uint)width;
  }
  iVar5 = 0;
  if (0 < height) {
    iVar5 = height;
  }
  for (; iVar10 != iVar5; iVar10 = iVar10 + 1) {
    for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
      puVar4[uVar9] = src_y[uVar9 * 2];
    }
    puVar4 = puVar4 + iVar1;
    src_y = src_y + (long)(src_stride >> 1) * 2;
  }
  uVar2 = width >> ((byte)uv_shift & 0x1f);
  iVar10 = height >> ((byte)uv_shift & 0x1f);
  puVar4 = dst[1];
  iVar1 = dst_stride[1];
  uVar9 = 0;
  uVar7 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar7 = uVar9;
  }
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  puVar3 = src_uv;
  for (; (int)uVar9 != iVar10; uVar9 = (ulong)((int)uVar9 + 1)) {
    puVar11 = puVar4;
    for (uVar8 = 0; (uint)((int)uVar7 * 2) != uVar8; uVar8 = uVar8 + 2) {
      *puVar11 = puVar3[(long)(int)uVar8 * 2];
      puVar11 = puVar11 + 1;
    }
    puVar3 = puVar3 + (long)(src_stridec >> 1) * 2;
    puVar4 = puVar4 + iVar1;
  }
  puVar4 = src_uv + 2;
  puVar3 = dst[2];
  iVar1 = dst_stride[2];
  for (iVar5 = 0; iVar5 != iVar10; iVar5 = iVar5 + 1) {
    puVar11 = puVar3;
    for (lVar6 = 0; uVar7 * 2 != lVar6; lVar6 = lVar6 + 2) {
      *puVar11 = puVar4[(long)(int)lVar6 * 2];
      puVar11 = puVar11 + 1;
    }
    puVar4 = puVar4 + (long)(src_stridec >> 1) * 2;
    puVar3 = puVar3 + iVar1;
  }
  return;
}

Assistant:

static void conv_fmt_16to8bit_c(unsigned char* src_y, unsigned char* src_uv, unsigned char* dst[3], int width, int height, int src_stride, int src_stridec, int dst_stride[3], int uv_shift) {
    int i, j;
    short* psrc = (short*)src_y;
    unsigned char* pdst = dst[0];
    int i_dst, i_src;

    i_src = src_stride >> 1;
    i_dst = dst_stride[0];
    for (i = 0; i < height; i++) {
        for (j = 0; j < width; j++) {
            pdst[j] = (unsigned char)psrc[j];
        }
        psrc += i_src;
        pdst += i_dst;
    }

    width >>= uv_shift;
    height >>= uv_shift;

    psrc = (short*)src_uv;
    pdst = dst[1];
    i_src = src_stridec >> 1;
    i_dst = dst_stride[1];
    for (i = 0; i < height; i++) {
        for (j = 0; j < width; j++) {
            pdst[j] = (unsigned char)psrc[j << 1];
        }
        psrc += i_src;
        pdst += i_dst;
    }

    psrc = ((short*)src_uv) + 1;
    pdst = dst[2];
    i_dst = dst_stride[2];
    for (i = 0; i < height; i++) {
        for (j = 0; j < width; j++) {
            pdst[j] = (unsigned char)psrc[j << 1];
        }
        psrc += i_src;
        pdst += i_dst;
    }
}